

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptArray::BigIndex::DeleteItem
          (BigIndex *this,RecyclableObject *obj,PropertyOperationFlags flags)

{
  BOOL BVar1;
  PropertyRecord *in_RAX;
  PropertyRecord *local_28;
  PropertyRecord *propertyRecord;
  
  if (this->index != 0xffffffff) {
    BVar1 = IndexTrace<unsigned_int>::DeleteItem(obj,&this->index,flags);
    return BVar1;
  }
  local_28 = in_RAX;
  JavascriptOperators::GetPropertyIdForInt
            (this->bigIndex,
             (((((obj->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr,&local_28);
  BVar1 = JavascriptOperators::DeleteProperty(obj,local_28->pid,flags);
  return BVar1;
}

Assistant:

BOOL JavascriptArray::BigIndex::DeleteItem(RecyclableObject* obj, PropertyOperationFlags flags) const
    {
        if (IsSmallIndex())
        {
            return small_index::DeleteItem(obj, index, flags);
        }
        else
        {
            PropertyRecord const * propertyRecord;
            JavascriptOperators::GetPropertyIdForInt(bigIndex, obj->GetScriptContext(), &propertyRecord);
            return JavascriptOperators::DeleteProperty(obj, propertyRecord->GetPropertyId(), flags);
        }
    }